

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# devices.cpp
# Opt level: O2

void initRegularSlotDevice
               (CDevice *device,int32_t slotSize,int32_t slotCount,int pageCount,int *initialPages)

{
  byte *memory;
  CDeviceSlot *pCVar1;
  CDevicePage *pCVar2;
  byte *memPtr;
  int32_t slotAddress;
  int adr;
  byte *pbVar3;
  int i;
  ulong __n;
  long lVar4;
  
  for (adr = 0; adr < slotCount * slotSize; adr = adr + slotSize) {
    CDevice::AddSlot(device,adr,slotSize);
  }
  __n = (ulong)(pageCount * slotSize);
  memory = (byte *)operator_new__(__n);
  memset(memory,0,__n);
  device->Memory = memory;
  pbVar3 = memory;
  for (; memory < pbVar3 + __n; memory = memory + slotSize) {
    CDevice::AddPage(device,memory,slotSize);
    pbVar3 = device->Memory;
  }
  for (lVar4 = 0; lVar4 < device->SlotsCount; lVar4 = lVar4 + 1) {
    pCVar1 = CDevice::GetSlot(device,(int)lVar4);
    pCVar2 = CDevice::GetPage(device,initialPages[lVar4]);
    pCVar1->Page = pCVar2;
    pCVar1->InitialPage = (int16_t)pCVar2->Number;
  }
  CDevice::SetSlot(device,device->SlotsCount + -1);
  return;
}

Assistant:

static void initRegularSlotDevice(CDevice* const device, const int32_t slotSize, const int32_t slotCount,
								  const int pageCount, const int* const initialPages) {
	for (int32_t slotAddress = 0; slotAddress < slotSize * slotCount; slotAddress += slotSize) {
		device->AddSlot(slotAddress, slotSize);
	}
	device->Memory = new byte[slotSize * pageCount]();
	for (byte* memPtr = device->Memory; memPtr < device->Memory + slotSize * pageCount; memPtr += slotSize) {
		device->AddPage(memPtr, slotSize);
	}
	for (int i = 0; i < device->SlotsCount; ++i) {
		CDeviceSlot* slot = device->GetSlot(i);
		slot->Page = device->GetPage(initialPages[i]);
		slot->InitialPage = slot->Page->Number;
	}
	device->SetSlot(device->SlotsCount - 1);
}